

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> *
randVec(vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,size_t size)

{
  result_type_conflict *prVar1;
  result_type_conflict rVar2;
  result_type_conflict *prVar3;
  allocator_type local_21;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,size,&local_21);
  prVar1 = (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (prVar3 = (__return_storage_ptr__->
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start; prVar3 != prVar1; prVar3 = prVar3 + 1) {
    rVar2 = utility::get_random<unsigned_long>(0,0xffffffffffffffff);
    *prVar3 = rVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

auto randVec(std::size_t size) {
  std::vector<std::uint64_t> v(size);
  std::generate(v.begin(), v.end(), []() { return utility::get_random(); });
  return v;
}